

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InternalStringNoCaseComparer.cpp
# Opt level: O2

int JsUtil::NoCaseComparer<JsUtil::CharacterBuffer<char16_t>_>::Compare
              (CharacterBuffer<char16_t> *s1,CharacterBuffer<char16_t> *s2)

{
  char16_t cVar1;
  char16_t cVar2;
  char16_t *pcVar3;
  char16_t *pcVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar7 = s1->len;
  if (uVar7 == s2->len) {
    pcVar3 = (s1->string).ptr;
    pcVar4 = (s2->string).ptr;
    if ((int)uVar7 < 1) {
      uVar7 = 0;
    }
    uVar8 = 0;
    do {
      if (uVar7 == uVar8) {
        return 0;
      }
      cVar1 = pcVar3[uVar8];
      iVar5 = tolower((uint)(ushort)cVar1);
      cVar2 = pcVar4[uVar8];
      iVar6 = tolower((uint)(ushort)cVar2);
      uVar8 = uVar8 + 1;
    } while (iVar5 == iVar6);
    uVar7 = -(uint)((ushort)cVar1 < (ushort)cVar2) | 1;
  }
  else {
    uVar7 = 1;
  }
  return uVar7;
}

Assistant:

int NoCaseComparer<JsUtil::CharacterBuffer<WCHAR>>::Compare(JsUtil::CharacterBuffer<WCHAR> const& s1, JsUtil::CharacterBuffer<WCHAR> const& s2)
    {
        if (s1.GetLength() != s2.GetLength()) return +1;
        int count = s1.GetLength();
        const char16* buf1 = s1.GetBuffer();
        const char16* buf2 = s2.GetBuffer();
        for (int i=0; i < count; i++)
        {
            if (tolower(buf1[i]) != tolower(buf2[i]))
            {
                return (buf1[i] < buf2[i] ? -1 : +1);
            }
        }
        return (0);
    }